

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
optimize_problem<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb)

{
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *pvVar1;
  solver_updated_cb *this_00;
  double dVar2;
  int iVar3;
  storage_type sVar4;
  result *prVar5;
  context *ctx_00;
  uint uVar6;
  ulong uVar7;
  result_type_conflict *__s;
  result_type_conflict rVar8;
  ulong uVar9;
  int *piVar10;
  raw_result<baryonyx::itm::maximize_tag> *source;
  long lVar11;
  thread *t;
  pointer ptVar12;
  solution *sol;
  int i;
  long lVar13;
  uint thread_number;
  int iVar14;
  long call_number;
  long lVar15;
  long __args_4;
  atomic_bool stop_task;
  int variables;
  result *local_1c8;
  uint local_1bc;
  long loop;
  unsigned_long local_1b0;
  context *local_1a8;
  ulong local_1a0;
  int constraints_remaining;
  double duration;
  double value;
  random_engine rng;
  vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
  functors;
  double cost_constant;
  default_cost_type<double> cost;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  constraints;
  reference_wrapper<const_baryonyx::itm::default_cost_type<double>_> local_118;
  reference_wrapper<const_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
  local_110;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
  best_recorder;
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  if (*(long *)(this + 0x128) != 0) {
    (**(code **)(this + 0x130))(this + 0x118,this);
  }
  make_merged_constraints(&constraints,(context *)this,(problem *)ctx);
  if ((constraints.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       constraints.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (lVar13._0_4_ = (ctx->parameters).seed, lVar13._4_4_ = (ctx->parameters).thread,
     lVar13 == (ctx->parameters).limit)) {
    __return_storage_ptr__->status = success;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].value = (ctx->parameters).pushing_objective_amplifier;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(ctx->parameters).time_limit;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(ctx->parameters).theta);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&(__return_storage_ptr__->affected_vars).names,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&(ctx->parameters).pushing_iteration_limit);
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(__return_storage_ptr__->affected_vars).values,
               (vector<signed_char,_std::allocator<signed_char>_> *)&(ctx->parameters).cost_norm);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&__return_storage_ptr__->variable_name,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&(ctx->parameters).init_kappa_improve_increase);
    goto LAB_0016c75d;
  }
  uVar7 = std::chrono::_V2::system_clock::now();
  if ((ulong)*(uint *)(this + 0xa8) != 0) {
    uVar7 = (ulong)*(uint *)(this + 0xa8);
  }
  rng._M_x = uVar7 % 0x7fffffff + (ulong)(uVar7 % 0x7fffffff == 0);
  variables = (int)((ulong)((ctx->parameters).limit - *(long *)&(ctx->parameters).seed) >> 2) *
              -0x55555555;
  default_cost_type<double>::default_cost_type
            (&cost,(objective_function *)&(ctx->parameters).delta,variables);
  cost_constant = (ctx->parameters).pushing_objective_amplifier;
  uVar6 = *(uint *)(this + 0xac);
  if ((int)uVar6 < 1) {
    uVar6 = std::thread::hardware_concurrency();
  }
  thread_number = uVar6 + (uVar6 == 0);
  uVar7 = (ulong)thread_number;
  functors.
  super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functors.
  super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  functors.
  super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&pool,uVar7,(allocator_type *)&best_recorder);
  local_1c8 = __return_storage_ptr__;
  local_1bc = uVar6;
  best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
  ::best_solution_recorder
            (&best_recorder,&rng,thread_number,&cost,cost_constant,variables,&constraints,
             *(int *)(this + 0xc4));
  __s = (result_type_conflict *)operator_new__(uVar7 * 8);
  local_1a0 = uVar7;
  memset(__s,0,uVar7 * 8);
  loop = 0;
  local_1b0 = 0xffffffffffffffff;
  rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&loop,&rng,(param_type *)&loop);
  *__s = rVar8;
  if (1 < local_1bc) {
    uVar7 = 1;
    do {
      rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&loop,&rng,(param_type *)&loop);
      __s[uVar7] = rVar8;
      uVar9 = uVar7 - 1;
      if (uVar9 != 0) {
        do {
          iVar14 = (int)uVar9;
          if (__s[uVar9 & 0xffffffff] == __s[uVar7]) {
            rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                              ((uniform_int_distribution<unsigned_long> *)&loop,&rng,
                               (param_type *)&loop);
            __s[uVar9 & 0xffffffff] = rVar8;
            iVar14 = (int)uVar7;
          }
          uVar9 = (ulong)(iVar14 - 1U);
        } while (iVar14 - 1U != 0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_1a0);
  }
  uVar7 = local_1a0;
  uVar6 = 0;
  LOCK();
  stop_task._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  loop = loop & 0xffffffff00000000;
  do {
    std::
    vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>>>
    ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
              ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>>>
                *)&functors,(context *)this,(uint *)&loop,__s + uVar6);
    uVar6 = (int)loop + 1;
    loop = CONCAT44(loop._4_4_,uVar6);
  } while (uVar6 != (uint)uVar7);
  iVar14 = local_1bc + (local_1bc == 0);
  lVar13 = 0;
  lVar15 = 0;
  local_1a8 = (context *)this;
  do {
    value = (double)((long)&(functors.
                             super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_ctx + lVar13);
    duration = (double)&stop_task;
    _constraints_remaining = &best_recorder;
    local_110._M_data = &constraints;
    local_118._M_data = &cost;
    std::thread::
    thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,double,baryonyx::itm::maximize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<double>const>,double&,void>
              ((thread *)&loop,
               (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>
                *)&value,(reference_wrapper<std::atomic<bool>_> *)&duration,
               (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>_>
                *)&constraints_remaining,&local_110,&variables,&local_118,&cost_constant);
    if (pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[lVar15]._M_id._M_thread != 0) {
      std::terminate();
    }
    pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start[lVar15]._M_id._M_thread = loop;
    lVar15 = lVar15 + 1;
    lVar13 = lVar13 + 0xc0;
  } while (iVar14 != (int)lVar15);
  lVar15 = std::chrono::_V2::steady_clock::now();
  this_00 = &local_1a8->update;
  lVar13 = local_1a0 * 0xc0;
  do {
    loop = 1;
    local_1b0 = 0;
    do {
      iVar14 = nanosleep((timespec *)&loop,(timespec *)&loop);
      if (iVar14 != -1) break;
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
    if ((local_1a8->update).super__Function_base._M_manager != (_Manager_type)0x0) {
      lVar11 = 0;
      __args_4 = 0;
      do {
        __args_4 = __args_4 +
                   *(long *)((long)&(functors.
                                     super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_call_number +
                            lVar11);
        lVar11 = lVar11 + 0xc0;
      } while (lVar13 != lVar11);
      storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::get_best
                (&best_recorder.m_storage,&constraints_remaining,&value,&duration,&loop);
      std::function<void_(int,_double,_long,_double,_long)>::operator()
                (this_00,constraints_remaining,value,loop,duration,__args_4);
    }
    lVar11 = std::chrono::_V2::steady_clock::now();
    ctx_00 = local_1a8;
    dVar2 = (local_1a8->parameters).time_limit;
  } while ((dVar2 <= 0.0) || ((double)(lVar11 - lVar15) / 1000000000.0 <= dVar2));
  LOCK();
  stop_task._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  prVar5 = local_1c8;
  for (ptVar12 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start; local_1c8 = prVar5,
      ptVar12 !=
      pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish; ptVar12 = ptVar12 + 1) {
    std::thread::join();
    prVar5 = local_1c8;
  }
  (prVar5->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(ctx->parameters).time_limit;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(prVar5->strings).
              super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(ctx->parameters).theta);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&(prVar5->affected_vars).names,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).pushing_iteration_limit);
  std::vector<signed_char,_std::allocator<signed_char>_>::operator=
            (&(prVar5->affected_vars).values,
             (vector<signed_char,_std::allocator<signed_char>_> *)&(ctx->parameters).cost_norm);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&prVar5->variable_name,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).init_kappa_improve_increase);
  prVar5->variables = variables;
  prVar5->constraints =
       (int)((ulong)((long)constraints.
                           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)constraints.
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  iVar14 = *best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  source = best_recorder.m_storage.m_data.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start + iVar14;
  iVar3 = best_recorder.m_storage.m_data.
          super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar14].remaining_constraints;
  prVar5->status = (uint)(iVar3 != 0) * 3;
  prVar5->duration =
       best_recorder.m_storage.m_data.
       super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar14].duration;
  prVar5->loop = best_recorder.m_storage.m_data.
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar14].loop;
  prVar5->remaining_constraints = iVar3;
  sVar4 = (ctx_00->parameters).storage;
  if (sVar4 == one) {
    pvVar1 = &local_1c8->solutions;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,1);
    sol = (pvVar1->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
          _M_impl.super__Vector_impl_data._M_start;
LAB_0016c663:
    convert<baryonyx::itm::maximize_tag>(source,sol,variables);
  }
  else {
    if (sVar4 == bound) {
      pvVar1 = &local_1c8->solutions;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,2);
      convert<baryonyx::itm::maximize_tag>
                (source,(pvVar1->
                        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>)
                        ._M_impl.super__Vector_impl_data._M_start,variables);
      source = storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::
               get_worst(&best_recorder.m_storage);
      sol = (pvVar1->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
            _M_impl.super__Vector_impl_data._M_start + 1;
      goto LAB_0016c663;
    }
    if (sVar4 == five) {
      pvVar1 = &local_1c8->solutions;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(pvVar1,5);
      lVar15 = 0;
      lVar13 = 0;
      do {
        convert<baryonyx::itm::maximize_tag>
                  (best_recorder.m_storage.m_data.
                   super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar13],
                   (solution *)
                   ((long)&(((pvVar1->
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             )._M_impl.super__Vector_impl_data._M_start)->variables).
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                   lVar15),variables);
        lVar13 = lVar13 + 1;
        lVar15 = lVar15 + 0x20;
      } while (lVar13 != 5);
    }
  }
  storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::show_population
            (&best_recorder.m_storage,ctx_00);
  if ((ctx_00->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(ctx_00->finish)._M_invoker)((_Any_data *)&ctx_00->finish,local_1c8);
  }
  operator_delete__(__s);
  if (best_recorder.m_kappa_append.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(best_recorder.m_kappa_append.super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)best_recorder.m_kappa_append.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)best_recorder.m_kappa_append.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  __return_storage_ptr__ = local_1c8;
  if ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)
      best_recorder.m_storage.m_random.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)best_recorder.m_storage.m_random.super_bit_array_impl.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  best_recorder.m_storage.m_random.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  if ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)
      best_recorder.m_storage.m_bastert.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)best_recorder.m_storage.m_bastert.super_bit_array_impl.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  best_recorder.m_storage.m_bastert.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  std::
  vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
  ::~vector(&best_recorder.m_storage.m_data);
  if (best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)best_recorder.m_storage.m_indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)best_recorder.m_storage.m_indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&pool);
  if (functors.
      super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(functors.
                    super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)functors.
                          super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)functors.
                          super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
      cost.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)cost.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
LAB_0016c75d:
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector(&constraints);
  return __return_storage_ptr__;
}

Assistant:

inline result
optimize_problem(const context& ctx, const problem& pb)
{
    result r;

    if (ctx.start)
        ctx.start(ctx.parameters);

    auto constraints{ make_merged_constraints(ctx, pb) };
    if (constraints.empty() || pb.vars.values.empty()) {
        r.status = result_status::success;
        r.solutions.resize(1);
        r.solutions.back().value = pb.objective.value;
        r.strings = pb.strings;
        r.affected_vars = pb.affected_vars;
        r.variable_name = pb.vars.names;
        return r;
    }

    random_engine rng(init_random_generator_seed(ctx));

    auto variables = length(pb.vars.values);
    auto cost = Cost(pb.objective, variables);
    auto cost_constant = pb.objective.value;

    const auto thread = get_thread_number(ctx);

    std::vector<optimize_functor<Solver, Float, Mode, Cost>> functors;
    std::vector<std::thread> pool(thread);

    best_solution_recorder<Cost, Float, Mode> best_recorder(
      rng,
      thread,
      cost,
      cost_constant,
      variables,
      constraints,
      ctx.parameters.init_population_size);

    auto seeds = generate_seed(rng, thread);

    std::atomic_bool stop_task;
    stop_task.store(false);

    for (unsigned i = 0u; i != thread; ++i)
        functors.emplace_back(ctx, i, seeds[i]);

    for (unsigned i = 0u; i != thread; ++i)
        pool[i] = std::thread(std::ref(functors[i]),
                              std::ref(stop_task),
                              std::ref(best_recorder),
                              std::cref(constraints),
                              variables,
                              std::cref(cost),
                              cost_constant);

    const auto start = std::chrono::steady_clock::now();
    auto end = start;

    do {
        std::this_thread::sleep_for(std::chrono::seconds{ 1L });

        if (ctx.update) {
            auto call_number = 0L;
            for (auto i = 0u; i != thread; ++i)
                call_number += functors[i].m_call_number;

            int constraints_remaining;
            long int loop;
            double value;
            double duration;

            best_recorder.get_best(
              constraints_remaining, value, duration, loop);

            ctx.update(
              constraints_remaining, value, loop, duration, call_number);
        }

        end = std::chrono::steady_clock::now();
    } while (!is_time_limit(ctx.parameters.time_limit, start, end));

    stop_task.store(true);

    for (auto& t : pool)
        t.join();

    r.strings = pb.strings;
    r.affected_vars = pb.affected_vars;
    r.variable_name = pb.vars.names;
    r.variables = variables;
    r.constraints = length(constraints);

    const auto& first = best_recorder.get_best(0);

    if (!first.is_solution())
        r.status = result_status::time_limit_reached;
    else
        r.status = result_status::success;

    r.duration = first.duration;
    r.loop = first.loop;
    r.remaining_constraints = first.remaining_constraints;

    switch (ctx.parameters.storage) {
    case solver_parameters::storage_type::one: {
        r.solutions.resize(1);
        convert(first, r.solutions[0], variables);
    } break;

    case solver_parameters::storage_type::bound: {
        r.solutions.resize(2);

        convert(first, r.solutions[0], variables);
        convert(best_recorder.get_worst(), r.solutions[1], variables);
    } break;

    case solver_parameters::storage_type::five: {
        r.solutions.resize(5);

        for (int i = 0; i != 5; ++i)
            convert(best_recorder.get_best(i), r.solutions[i], variables);
    } break;
    }

    best_recorder.show_population(ctx);

    if (ctx.finish)
        ctx.finish(r);

    return r;
}